

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::ShouldRemove
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  bool bVar1;
  cmMakefile *param_2_local;
  cmListFileFunction *lff_local;
  cmWhileFunctionBlocker *this_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "endwhile");
  if ((bVar1) &&
     ((bVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty
                         (&lff->Arguments), bVar1 ||
      (bVar1 = std::operator==(&lff->Arguments,&this->Args), bVar1)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmWhileFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                          cmMakefile&)
{
  if (lff.Name.Lower == "endwhile") {
    // if the endwhile has arguments, then make sure
    // they match the arguments of the matching while
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }
  return false;
}